

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::writeSymTabWarnings
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *warnings)

{
  undefined8 this_00;
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *warning;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ostream local_238 [8];
  ofstream stream;
  undefined1 local_38 [8];
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *warnings_local;
  Compiler *this_local;
  
  fileName.field_2._8_8_ = warnings;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(warnings);
  if (!bVar1) {
    extractFileName_abi_cxx11_((string *)local_38,this);
    std::operator+(&local_278,"Output/",(string *)local_38);
    std::operator+(&local_258,&local_278,"_symtab_warnings.txt");
    std::ofstream::ofstream(local_238,(string *)&local_258,_S_out);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::operator<<(local_238,
                    "============================ SYMBOL TABLE WARNINGS ========================= \n"
                   );
    this_00 = fileName.field_2._8_8_;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)fileName.field_2._8_8_);
    warning = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&warning), bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      poVar3 = std::operator<<(local_238,(string *)pbVar2);
      std::operator<<(poVar3,"\n");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_238);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Compiler::writeSymTabWarnings(const std::vector<std::string> &warnings) {
    if (warnings.empty()) return;
    std::string fileName = extractFileName();
    std::ofstream stream("Output/" + fileName + "_symtab_warnings.txt");
    stream << "============================ SYMBOL TABLE WARNINGS ========================= \n";
    for (const auto & warning : warnings) stream << warning << "\n";
    stream.close();
}